

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyInteger
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  uchar *puVar3;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_210;
  char *local_1c8;
  char *local_1c0 [3];
  MessageBuilder local_1a8;
  uchar local_24;
  StateQueryMemoryWriteGuard<unsigned_char> local_23;
  GLint local_20;
  GLboolean expectedGLState;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  GLint reference_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  local_20 = reference;
  _expectedGLState = name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            (&local_23);
  pname = _expectedGLState;
  puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::operator&
                     (&local_23);
  glu::CallLogWrapper::glGetBooleanv(&(this->super_StateVerifier).super_CallLogWrapper,pname,puVar3)
  ;
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_23,testCtx);
  if (bVar1) {
    local_24 = local_20 != 0;
    puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                       ((StateQueryMemoryWriteGuard *)&local_23);
    if (*puVar3 != local_24) {
      this_00 = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [20])"// ERROR: expected ");
      local_1c0[0] = "mapped_ == GL_FALSE";
      if (local_24 == '\x01') {
        local_1c0[0] = "mapped_ == GL_TRUE";
      }
      local_1c0[0] = local_1c0[0] + 0xb;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1c0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
      puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_unsigned_char_((StateQueryMemoryWriteGuard *)&local_23);
      if (*puVar3 == '\x01') {
        local_210 = "GL_TRUE";
      }
      else {
        puVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_unsigned_char_((StateQueryMemoryWriteGuard *)&local_23);
        local_210 = "non-boolean";
        if (*puVar3 == '\0') {
          local_210 = "GL_FALSE";
        }
      }
      local_1c8 = local_210;
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1c8);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
      }
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyInteger (tcu::TestContext& testCtx, GLenum name, GLint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLboolean expectedGLState = reference ? GL_TRUE : GL_FALSE;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << (expectedGLState==GL_TRUE ? "GL_TRUE" : "GL_FALSE") << "; got " << (state == GL_TRUE ? "GL_TRUE" : (state == GL_FALSE ? "GL_FALSE" : "non-boolean")) << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}